

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_packet.cpp
# Opt level: O2

MPP_RET mpp_packet_init(MppPacket *packet,void *data,size_t size)

{
  MppPacket pvVar1;
  MPP_RET MVar2;
  
  if (packet == (MppPacket *)0x0) {
    _mpp_log_l(2,"mpp_packet","invalid NULL input packet\n","mpp_packet_init");
    MVar2 = MPP_ERR_NULL_PTR;
  }
  else {
    MVar2 = mpp_packet_new(packet);
    if (MVar2 == MPP_OK) {
      pvVar1 = *packet;
      *(void **)((long)pvVar1 + 0x10) = data;
      *(void **)((long)pvVar1 + 8) = data;
      *(size_t *)((long)pvVar1 + 0x20) = size;
      *(size_t *)((long)pvVar1 + 0x18) = size;
      MVar2 = MPP_OK;
    }
    else {
      _mpp_log_l(2,"mpp_packet","new packet failed\n","mpp_packet_init");
    }
  }
  return MVar2;
}

Assistant:

MPP_RET mpp_packet_init(MppPacket *packet, void *data, size_t size)
{
    if (NULL == packet) {
        mpp_err_f("invalid NULL input packet\n");
        return MPP_ERR_NULL_PTR;
    }

    MPP_RET ret = mpp_packet_new(packet);
    if (ret) {
        mpp_err_f("new packet failed\n");
        return ret;
    }
    MppPacketImpl *p = (MppPacketImpl *)*packet;
    p->data = p->pos    = data;
    p->size = p->length = size;

    return MPP_OK;
}